

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O0

int __thiscall ncnn::Convolution_x86::create_pipeline(Convolution_x86 *this,Option *opt)

{
  ulong uVar1;
  Layer *pLVar2;
  float *pfVar3;
  ParamDict *this_00;
  long in_RSI;
  long *in_RDI;
  int num_input_2;
  int kernel_size;
  int num_input_1;
  int num_input;
  ParamDict pd_3;
  ParamDict pd_2;
  ParamDict pd_1;
  ParamDict pd;
  undefined8 in_stack_ffffffffffffdba8;
  int index;
  ParamDict *in_stack_ffffffffffffdbb0;
  ParamDict *in_stack_ffffffffffffdbe0;
  int in_stack_ffffffffffffdca0;
  int in_stack_ffffffffffffdca4;
  undefined4 in_stack_ffffffffffffdca8;
  int in_stack_ffffffffffffdcac;
  int in_stack_ffffffffffffdcb0;
  int in_stack_ffffffffffffdcb4;
  Mat *in_stack_ffffffffffffdcb8;
  Mat *in_stack_ffffffffffffdcc0;
  ParamDict local_1b20;
  ParamDict local_1220;
  undefined1 local_910 [2304];
  long local_10;
  
  index = (int)((ulong)in_stack_ffffffffffffdba8 >> 0x20);
  local_10 = in_RSI;
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xbc) == 1) {
    pLVar2 = create_layer(index);
    in_RDI[1] = (long)pLVar2;
    ParamDict::ParamDict(in_stack_ffffffffffffdbe0);
    (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],local_910);
    ParamDict::~ParamDict(in_stack_ffffffffffffdbb0);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xbc) == 2) {
    pLVar2 = create_layer(index);
    in_RDI[1] = (long)pLVar2;
    ParamDict::ParamDict(in_stack_ffffffffffffdbe0);
    pfVar3 = Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc0),0);
    ParamDict::set(&local_1220,0,*pfVar3);
    (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],&local_1220);
    ParamDict::~ParamDict(in_stack_ffffffffffffdbb0);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xbc) == 3) {
    pLVar2 = create_layer(index);
    in_RDI[1] = (long)pLVar2;
    ParamDict::ParamDict(in_stack_ffffffffffffdbe0);
    this_00 = (ParamDict *)
              Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc0),0);
    ParamDict::set(&local_1b20,0,(float)this_00->params[0].type);
    pfVar3 = Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc0),1);
    ParamDict::set(&local_1b20,1,*pfVar3);
    (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],&local_1b20);
    ParamDict::~ParamDict(this_00);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xbc) == 4) {
    pLVar2 = create_layer(index);
    in_RDI[1] = (long)pLVar2;
    ParamDict::ParamDict(in_stack_ffffffffffffdbe0);
    (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],&stack0xffffffffffffdbe0);
    ParamDict::~ParamDict(in_stack_ffffffffffffdbb0);
  }
  if (in_RDI[1] != 0) {
    (**(code **)(*(long *)in_RDI[1] + 0x20))((long *)in_RDI[1],local_10);
  }
  *(undefined1 *)(in_RDI + 2) = 0;
  if (((((((*(byte *)(local_10 + 0x18) & 1) != 0) &&
         (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x84) == 3)) &&
        (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x88) == 3)) &&
       ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x8c) == 1 &&
        (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x90) == 1)))) &&
      ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x94) == 1 &&
       ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x98) == 1 &&
        (uVar1 = (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb4) / 9,
        0xf < (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) /
                   (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x80)))))))) &&
     (0xf < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x80))) {
    *(undefined1 *)(in_RDI + 2) = 1;
  }
  if ((*(byte *)(in_RDI + 2) & 1) != 0) {
    if ((*(byte *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1c8) & 1) == 0) {
      conv3x3s1_winograd23_transform_kernel_sse
                ((Mat *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                 (Mat *)CONCAT44(in_stack_ffffffffffffdcac,in_stack_ffffffffffffdca8),
                 in_stack_ffffffffffffdca4,in_stack_ffffffffffffdca0);
    }
    else {
      conv3x3s1_winograd43_transform_kernel_int8_sse
                ((Mat *)CONCAT44(in_stack_ffffffffffffdcb4,in_stack_ffffffffffffdcb0),
                 (Mat *)CONCAT44(in_stack_ffffffffffffdcac,in_stack_ffffffffffffdca8),
                 in_stack_ffffffffffffdca4,in_stack_ffffffffffffdca0);
    }
  }
  if ((*(byte *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1c8) & 1) == 0) {
    conv_im2col_sgemm_transform_kernel_sse
              (in_stack_ffffffffffffdcc0,in_stack_ffffffffffffdcb8,in_stack_ffffffffffffdcb4,
               in_stack_ffffffffffffdcb0,in_stack_ffffffffffffdcac);
  }
  return 0;
}

Assistant:

int Convolution_x86::create_pipeline(const Option& opt)
{
    if (activation_type == 1)
    {
        activation = ncnn::create_layer(ncnn::LayerType::ReLU);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }
    else if (activation_type == 2)
    {
        activation = ncnn::create_layer(ncnn::LayerType::ReLU);

        ncnn::ParamDict pd;
        pd.set(0, activation_params[0]);// slope
        activation->load_param(pd);
    }
    else if (activation_type == 3)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Clip);

        ncnn::ParamDict pd;
        pd.set(0, activation_params[0]);// min
        pd.set(1, activation_params[1]);// max
        activation->load_param(pd);
    }
    else if (activation_type == 4)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Sigmoid);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }

    if (activation)
    {
        activation->create_pipeline(opt);
    }

    use_winograd3x3 = false;

    if (opt.use_winograd_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        int num_input = weight_data_size / 9 / num_output;
        // winograd is slow on small channel count
        if(num_input >= 16 && num_output >= 16)
            use_winograd3x3 = true;
    }           

    if (use_winograd3x3)
    {
        int num_input = weight_data_size / 9 / num_output;

        if (use_int8_inference)
            // conv3x3s1_winograd23_transform_kernel_int8_sse(weight_data, weight_3x3_winograd23_data, num_input, num_output);
            conv3x3s1_winograd43_transform_kernel_int8_sse(weight_data, weight_3x3_winograd23_data, num_input, num_output);
        else
            conv3x3s1_winograd23_transform_kernel_sse(weight_data, weight_3x3_winograd23_data, num_input, num_output);
//             conv3x3s1_winograd43_transform_kernel_sse(weight_data, weight_3x3_winograd43_data, num_input, num_output);
    }

    if (use_int8_inference == false)
    {
        int kernel_size = kernel_w * kernel_h;
        int num_input = weight_data_size / kernel_size / num_output;

        conv_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_size);
    }       

    return 0;
}